

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O2

void __thiscall Graph::run_GreedyAlgorithm(Graph *this)

{
  bool *pbVar1;
  double dVar2;
  Car *pCVar3;
  Node a;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  ostream *poVar8;
  ulong unaff_RBP;
  int node_idx;
  ulong uVar9;
  long lVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  double local_88;
  
  uVar9 = 0;
LAB_00106234:
  do {
    uVar7 = uVar9;
    bVar4 = is_all_visited(this);
    if (bVar4) {
LAB_001063d6:
      if (this->cars[uVar7].now_idx != 0) {
        Car::add_node(this->cars + uVar7,this->nodes,this->distance_matrix);
      }
      poVar8 = std::operator<<((ostream *)&std::cout,"algorithm done.");
      std::endl<char,std::char_traits<char>>(poVar8);
      return;
    }
    pCVar3 = this->cars;
    if (pCVar3[uVar7].tour.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
        super__Vector_impl_data._M_start ==
        pCVar3[uVar7].tour.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      Car::add_node(pCVar3 + uVar7,this->nodes,this->distance_matrix);
    }
    bVar4 = true;
    lVar10 = 0;
    local_88 = 100000.0;
    for (uVar9 = 1; (long)uVar9 < (long)this->num_node; uVar9 = uVar9 + 1) {
      if ((((&this->nodes[1].visited)[lVar10] == false) &&
          (bVar5 = Car::ok_capacity(this->cars + uVar7,*(Node *)((long)&this->nodes[1].x + lVar10)),
          bVar5)) &&
         (pbVar1 = &this->nodes[1].visited + lVar10, a._16_8_ = *(undefined8 *)pbVar1,
         a._0_16_ = *(undefined1 (*) [16])((long)&this->nodes[1].x + lVar10),
         a._24_8_ = *(undefined8 *)(pbVar1 + 8),
         bVar5 = Car::ok_time(this->cars + uVar7,a,this->distance_matrix), bVar5)) {
        dVar2 = this->distance_matrix[this->cars[uVar7].now_idx][uVar9];
        if (dVar2 < local_88) {
          unaff_RBP = uVar9;
        }
        unaff_RBP = unaff_RBP & 0xffffffff;
        uVar11 = SUB84(dVar2,0);
        uVar12 = (int)((ulong)dVar2 >> 0x20);
        if (local_88 <= dVar2) {
          uVar11 = SUB84(local_88,0);
          uVar12 = (int)((ulong)local_88 >> 0x20);
        }
        bVar4 = (bool)(bVar4 & local_88 <= dVar2);
        local_88 = (double)CONCAT44(uVar12,uVar11);
      }
      lVar10 = lVar10 + 0x20;
    }
    if (!bVar4) {
      Car::add_node(this->cars + uVar7,this->nodes + (int)unaff_RBP,this->distance_matrix);
      uVar9 = uVar7;
      goto LAB_00106234;
    }
    uVar6 = (int)uVar7 + 1;
    if (this->num_car <= (int)uVar6) {
      poVar8 = std::operator<<((ostream *)&std::cout,"Cannot solve this by Greedy algorithm.");
      std::endl<char,std::char_traits<char>>(poVar8);
      goto LAB_001063d6;
    }
    uVar9 = (ulong)uVar6;
    if (this->cars[uVar7].now_idx != 0) {
      Car::add_node(this->cars + uVar7,this->nodes,this->distance_matrix);
    }
  } while( true );
}

Assistant:

void Graph::run_GreedyAlgorithm()
{
	int car_idx = 0;
	while(!is_all_visited()){
		int best_node_idx;
		double min_distance = 100000;
		bool is_return_depot = true;
		
		if(cars[car_idx].tour.empty()){
			cars[car_idx].add_node(&nodes[0], distance_matrix);// nodes[0] is depot
		}

		for(int node_idx = 1; node_idx < num_node; node_idx++){
			if(!nodes[node_idx].visited){
				if(cars[car_idx].ok_capacity(nodes[node_idx])){
					if(cars[car_idx].ok_time(nodes[node_idx], distance_matrix)){
						double tmp_distance = distance_matrix[cars[car_idx].now_idx][node_idx];
						if(tmp_distance < min_distance){
							min_distance = tmp_distance;
							is_return_depot = false;
							best_node_idx = node_idx;
						}
					}
				}
			}
		}

		if(!is_return_depot){
			cars[car_idx].add_node(&nodes[best_node_idx], distance_matrix);
		}
		else{// if edges are not found, return depot
			if(car_idx + 1 < num_car){// check if the rest of vehicles exists
				if(cars[car_idx].now_idx != 0){// in case the vehicle did not return back to the depot
					cars[car_idx].add_node(&nodes[0], distance_matrix);
				}
				car_idx += 1;// assign next vehicle
			}
			else{
				std::cout << "Cannot solve this by Greedy algorithm." << std::endl;
				break;// std::exit(0);
			}
			
		}
	}//while loop done
	if(cars[car_idx].now_idx != 0){// in case the vehicle did not return back to the depot
				cars[car_idx].add_node(&nodes[0], distance_matrix);
	}
	std::cout << "algorithm done." << std::endl;
}